

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O1

SquareMatrix<float> __thiscall
qclab::qgates::QControlledGate2<float>::matrix(QControlledGate2<float> *this)

{
  _Head_base<0UL,_float_*,_false> _Var1;
  int iVar2;
  __uniq_ptr_impl<float,_std::default_delete<float[]>_> _Var3;
  long *plVar4;
  int64_t i;
  long lVar5;
  _Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_> extraout_RDX;
  float *extraout_RDX_00;
  float *extraout_RDX_01;
  float *extraout_RDX_02;
  float *extraout_RDX_03;
  _Head_base<0UL,_float_*,_false> extraout_RDX_04;
  float *extraout_RDX_05;
  __uniq_ptr_impl<float,_std::default_delete<float[]>_> extraout_RDX_06;
  tuple<float_*,_std::default_delete<float[]>_> extraout_RDX_07;
  long *in_RSI;
  pointer *__ptr;
  data_type *pdVar7;
  SquareMatrix<float> SVar8;
  matrix_type E1;
  matrix_type E0;
  matrix_type CG;
  matrix_type I2;
  SquareMatrix<float> SStack_a8;
  SquareMatrix<float> local_98;
  SquareMatrix<float> local_88;
  SquareMatrix<float> local_78;
  SquareMatrix<float> local_68;
  SquareMatrix<float> local_58;
  SquareMatrix<float> local_48;
  SquareMatrix<float> local_38;
  SquareMatrix<float> local_28;
  _Head_base<0UL,_float_*,_false> _Var6;
  
  local_68.size_ = 2;
  local_68.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(0x10);
  *(undefined8 *)
   local_68.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
   super__Head_base<0UL,_float_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)local_68.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) = 0;
  lVar5 = 0;
  _Var3._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (tuple<float_*,_std::default_delete<float[]>_>)
       (tuple<float_*,_std::default_delete<float[]>_>)
       local_68.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
       super__Head_base<0UL,_float_*,_false>._M_head_impl;
  do {
    *(undefined4 *)
     _Var3._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
     super__Head_base<0UL,_float_*,_false>._M_head_impl = 0x3f800000;
    lVar5 = lVar5 + 1;
    _Var3._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (tuple<float_*,_std::default_delete<float[]>_>)
         ((long)_Var3._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc);
  } while (lVar5 != 2);
  local_88.size_ = 2;
  local_88.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(0x10);
  *(undefined8 *)
   local_88.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
   super__Head_base<0UL,_float_*,_false>._M_head_impl = 0x3f800000;
  *(undefined8 *)
   ((long)local_88.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) = 0;
  local_98.size_ = 2;
  local_98.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(0x10);
  *(undefined4 *)
   local_98.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
   super__Head_base<0UL,_float_*,_false>._M_head_impl = 0;
  *(undefined4 *)
   ((long)local_98.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 4) = 0;
  *(undefined4 *)
   ((long)local_98.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) = 0;
  *(undefined4 *)
   ((long)local_98.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc) = 0x3f800000;
  plVar4 = (long *)(**(code **)(*in_RSI + 0x80))();
  (**(code **)(*plVar4 + 0x38))(&local_78,plVar4);
  lVar5 = in_RSI[1];
  if (*(int *)((long)in_RSI + 0xc) == 0) {
    iVar2 = (**(code **)(*in_RSI + 0x78))();
    if ((int)lVar5 < iVar2) {
      dense::kron<float>((dense *)&local_28,&local_88,&local_78);
      dense::kron<float>((dense *)&SStack_a8,&local_98,&local_68);
      SVar8 = dense::operator+((dense *)this,&local_28,&SStack_a8);
      _Var6._M_head_impl =
           (float *)SVar8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                    _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                    super__Head_base<0UL,_float_*,_false>._M_head_impl;
      if ((_Head_base<0UL,_float_*,_false>)
          SStack_a8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl != (_Head_base<0UL,_float_*,_false>)0x0
         ) {
        operator_delete__((void *)SStack_a8.data_._M_t.
                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl);
        _Var6._M_head_impl = extraout_RDX_00;
      }
      pdVar7 = &local_28.data_;
    }
    else {
      dense::kron<float>((dense *)&local_38,&local_78,&local_88);
      dense::kron<float>((dense *)&SStack_a8,&local_68,&local_98);
      SVar8 = dense::operator+((dense *)this,&local_38,&SStack_a8);
      _Var6._M_head_impl =
           (float *)SVar8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                    _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                    super__Head_base<0UL,_float_*,_false>._M_head_impl;
      if ((_Head_base<0UL,_float_*,_false>)
          SStack_a8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl != (_Head_base<0UL,_float_*,_false>)0x0
         ) {
        operator_delete__((void *)SStack_a8.data_._M_t.
                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl);
        _Var6._M_head_impl = extraout_RDX_02;
      }
      pdVar7 = &local_38.data_;
    }
  }
  else {
    iVar2 = (**(code **)(*in_RSI + 0x78))();
    if ((int)lVar5 < iVar2) {
      dense::kron<float>((dense *)&local_48,&local_88,&local_68);
      dense::kron<float>((dense *)&SStack_a8,&local_98,&local_78);
      SVar8 = dense::operator+((dense *)this,&local_48,&SStack_a8);
      _Var6._M_head_impl =
           (float *)SVar8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                    _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                    super__Head_base<0UL,_float_*,_false>._M_head_impl;
      if ((_Head_base<0UL,_float_*,_false>)
          SStack_a8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl != (_Head_base<0UL,_float_*,_false>)0x0
         ) {
        operator_delete__((void *)SStack_a8.data_._M_t.
                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl);
        _Var6 = extraout_RDX.super__Head_base<0UL,_float_*,_false>._M_head_impl;
      }
      pdVar7 = &local_48.data_;
    }
    else {
      dense::kron<float>((dense *)&local_58,&local_68,&local_88);
      dense::kron<float>((dense *)&SStack_a8,&local_78,&local_98);
      SVar8 = dense::operator+((dense *)this,&local_58,&SStack_a8);
      _Var6._M_head_impl =
           (float *)SVar8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                    _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                    super__Head_base<0UL,_float_*,_false>._M_head_impl;
      if ((_Head_base<0UL,_float_*,_false>)
          SStack_a8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl != (_Head_base<0UL,_float_*,_false>)0x0
         ) {
        operator_delete__((void *)SStack_a8.data_._M_t.
                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl);
        _Var6._M_head_impl = extraout_RDX_01;
      }
      pdVar7 = &local_58.data_;
    }
  }
  _Var1._M_head_impl =
       (pdVar7->_M_t).super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
       super__Head_base<0UL,_float_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (float *)0x0) {
    operator_delete__(_Var1._M_head_impl);
    _Var6._M_head_impl = extraout_RDX_03;
  }
  (pdVar7->_M_t).super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = (float *)0x0;
  if ((tuple<float_*,_std::default_delete<float[]>_>)
      local_78.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl != (_Head_base<0UL,_float_*,_false>)0x0) {
    operator_delete__((void *)local_78.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
    _Var6._M_head_impl = extraout_RDX_04._M_head_impl;
  }
  if (local_98.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)local_98.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
    _Var6._M_head_impl = extraout_RDX_05;
  }
  if ((_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)
      local_88.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl != (float *)0x0) {
    operator_delete__((void *)local_88.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
    _Var6._M_head_impl =
         (float *)extraout_RDX_06._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl;
  }
  if (local_68.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)local_68.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
    _Var6._M_head_impl =
         (float *)extraout_RDX_07.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl;
  }
  SVar8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)_Var6._M_head_impl;
  SVar8.size_ = (size_type_conflict)this;
  return SVar8;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using matrix_type = qclab::dense::SquareMatrix< T > ;
          const matrix_type  I2 = qclab::dense::eye< T >( 2 ) ;
          const matrix_type  E0( 1 , 0 ,
                                 0 , 0 ) ;
          const matrix_type  E1( 0 , 0 ,
                                 0 , 1 ) ;
          const matrix_type  CG = this->gate()->matrix() ;
          if ( controlState_ == 0 ) {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , CG ) +
                     qclab::dense::kron( E1 , I2 ) ;
            } else {
              return qclab::dense::kron( CG , E0 ) +
                     qclab::dense::kron( I2 , E1 ) ;
            }
          } else {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , I2 ) +
                     qclab::dense::kron( E1 , CG ) ;
            } else {
              return qclab::dense::kron( I2 , E0 ) +
                     qclab::dense::kron( CG , E1 ) ;
            }
          }
        }